

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem_CGBG_FF.cpp
# Opt level: O0

void __thiscall
Problem_CGBG_FF::Problem_CGBG_FF
          (Problem_CGBG_FF *this,size_t nrHouses,size_t nrFLs,size_t nrAgents,
          size_t nrActionsPerAgent,size_t nrObservedHousesPerAgent,size_t k)

{
  ulong uVar1;
  ostream *poVar2;
  long in_RDX;
  long in_RSI;
  long *in_RDI;
  long in_R8;
  Problem_CGBG_FF *in_R9;
  undefined1 auVar3 [16];
  long in_stack_00000008;
  Index hI_1;
  Index hI;
  Index agI_1;
  Index agI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffc98;
  ostream *in_stack_fffffffffffffca0;
  allocator_type *in_stack_fffffffffffffca8;
  Problem_CGBG_FF *in_stack_fffffffffffffcb0;
  size_type in_stack_fffffffffffffcb8;
  Problem_CGBG_FF *in_stack_fffffffffffffcc0;
  Problem_CGBG_FF *in_stack_fffffffffffffcd0;
  Scope *in_stack_fffffffffffffce8;
  ostream *in_stack_fffffffffffffcf0;
  uint local_1a0;
  uint local_19c;
  string local_198 [32];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffe88;
  uint local_154;
  uint local_150;
  Index in_stack_ffffffffffffff5c;
  Problem_CGBG_FF *in_stack_ffffffffffffff60;
  
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x8eb4d4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(value_type_conflict2 *)in_stack_fffffffffffffcb0,
             (allocator_type *)in_stack_fffffffffffffca8);
  auVar3._0_8_ = std::pow<unsigned_long,unsigned_long>
                           ((unsigned_long)in_stack_fffffffffffffca0,
                            (unsigned_long)in_stack_fffffffffffffc98);
  auVar3._8_8_ = 0;
  vcvttsd2usi_avx512f(auVar3);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x8eb557);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(value_type_conflict2 *)in_stack_fffffffffffffcb0,
             (allocator_type *)in_stack_fffffffffffffca8);
  BayesianGameCollaborativeGraphical::BayesianGameCollaborativeGraphical
            (&in_stack_fffffffffffffcb0->super_BayesianGameCollaborativeGraphical,
             (size_t)in_stack_fffffffffffffca8,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffca0,
             in_stack_fffffffffffffc98);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcb0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x8eb5bf);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffcb0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x8eb5d9);
  *in_RDI = (long)&PTR__Problem_CGBG_FF_00d0d628;
  Scope::Scope((Scope *)in_stack_fffffffffffffca0);
  in_RDI[0x26] = in_RSI;
  in_RDI[0x27] = in_RDX;
  in_RDI[0x28] = in_RDX;
  in_RDI[0x29] = in_R8;
  in_RDI[0x2a] = (long)in_R9;
  in_RDI[0x2b] = in_stack_00000008;
  in_RDI[0x2c] = in_stack_00000008;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  std::
  map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
  ::map((map<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double,_std::less<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_double>_>_>
         *)0x8eb6a4);
  Scope::Scope((Scope *)in_stack_fffffffffffffca0);
  std::allocator<Scope>::allocator((allocator<Scope> *)0x8eb6ee);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(value_type *)in_stack_fffffffffffffcb0,
             (allocator_type *)in_stack_fffffffffffffca8);
  std::allocator<Scope>::~allocator((allocator<Scope> *)0x8eb722);
  Scope::~Scope((Scope *)0x8eb72f);
  Scope::Scope((Scope *)in_stack_fffffffffffffca0);
  std::allocator<Scope>::allocator((allocator<Scope> *)0x8eb779);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(value_type *)in_stack_fffffffffffffcb0,
             (allocator_type *)in_stack_fffffffffffffca8);
  std::allocator<Scope>::~allocator((allocator<Scope> *)0x8eb7ad);
  Scope::~Scope((Scope *)0x8eb7ba);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8eb80e);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x8eb823);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
           (value_type *)in_stack_fffffffffffffcb0,(allocator_type *)in_stack_fffffffffffffca8);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x8eb857);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcb0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x8eb8b8);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x8eb8cd);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
           (value_type *)in_stack_fffffffffffffcb0,(allocator_type *)in_stack_fffffffffffffca8);
  std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::~allocator
            ((allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)0x8eb901);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffcb0);
  std::allocator<double>::allocator((allocator<double> *)0x8eb95b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(value_type_conflict3 *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8);
  std::allocator<double>::~allocator((allocator<double> *)0x8eb98f);
  std::allocator<double>::allocator((allocator<double> *)0x8eb9dc);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(value_type_conflict3 *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8);
  std::allocator<double>::~allocator((allocator<double> *)0x8eba10);
  std::allocator<double>::allocator((allocator<double> *)0x8eba5d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(value_type_conflict3 *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8);
  std::allocator<double>::~allocator((allocator<double> *)0x8eba91);
  std::allocator<double>::allocator((allocator<double> *)0x8ebade);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,(value_type_conflict3 *)in_stack_fffffffffffffcb0,
             in_stack_fffffffffffffca8);
  std::allocator<double>::~allocator((allocator<double> *)0x8ebb12);
  local_150 = 0;
  while( true ) {
    uVar1 = (**(code **)(*in_RDI + 0x18))();
    if (uVar1 <= local_150) break;
    Scope::Insert((Scope *)in_stack_fffffffffffffca0,
                  (Index)((ulong)in_stack_fffffffffffffc98 >> 0x20));
    local_150 = local_150 + 1;
  }
  ScatterHouses(in_stack_fffffffffffffcb0);
  ScatterAgents(in_stack_fffffffffffffcc0);
  AssignAgentActionsToHouses(in_R9);
  AssignAgentTypesToHouses(in_stack_fffffffffffffcd0);
  poVar2 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Assignment summary:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_154 = 0;
  while( true ) {
    uVar1 = (**(code **)(*in_RDI + 0x18))();
    if (uVar1 <= local_154) break;
    poVar2 = std::operator<<((ostream *)&std::cout,"Agent ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_154);
    poVar2 = std::operator<<(poVar2,"...\n\tcan fight fire at houses:");
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *)in_stack_fffffffffffffca0,(size_type)in_stack_fffffffffffffc98);
    PrintTools::SoftPrintVector<unsigned_int>(in_stack_fffffffffffffe88);
    poVar2 = std::operator<<(poVar2,(string *)&stack0xfffffffffffffe88);
    in_stack_fffffffffffffcf0 = std::operator<<(poVar2,"\n\tand can observe houses:");
    in_stack_fffffffffffffce8 =
         (Scope *)std::
                  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ::at((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        *)in_stack_fffffffffffffca0,(size_type)in_stack_fffffffffffffc98);
    PrintTools::SoftPrintVector<unsigned_int>(in_stack_fffffffffffffe88);
    poVar2 = std::operator<<(in_stack_fffffffffffffcf0,local_198);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe88);
    local_154 = local_154 + 1;
  }
  for (local_19c = 0; (ulong)local_19c < (ulong)in_RDI[0x26]; local_19c = local_19c + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"House ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_19c);
    std::operator<<(poVar2,"...\n\tcan be visited by agents :");
    std::vector<Scope,_std::allocator<Scope>_>::at
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffca0,
               (size_type)in_stack_fffffffffffffc98);
    poVar2 = ::operator<<(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    std::operator<<(poVar2,"\n\tand by observed by agents:");
    std::vector<Scope,_std::allocator<Scope>_>::at
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffca0,
               (size_type)in_stack_fffffffffffffc98);
    in_stack_fffffffffffffca0 = ::operator<<(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    std::ostream::operator<<(in_stack_fffffffffffffca0,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (local_1a0 = 0; (ulong)local_1a0 < (ulong)in_RDI[0x26]; local_1a0 = local_1a0 + 1) {
    AddEdge(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  }
  return;
}

Assistant:

Problem_CGBG_FF::Problem_CGBG_FF(
                size_t nrHouses,
                size_t nrFLs,
                size_t nrAgents,
                size_t nrActionsPerAgent,       //i.e., z
                size_t nrObservedHousesPerAgent,//i.e., y
                size_t k                        //the maximum number of agents in a house's payoff function

    )
    :
        BayesianGameCollaborativeGraphical(
                nrAgents, 
                vector<size_t>(nrAgents, nrActionsPerAgent),
#if USE_FLAMES_NOFLAMES_OBS
                vector<size_t>(nrAgents, pow(2, nrObservedHousesPerAgent))
#else
                vector<size_t>(nrAgents, pow(nrFLs, nrObservedHousesPerAgent))
#endif
                )
        ,_m_allAgents()
        ,_m_nrHouses(nrHouses)
        ,_m_nrFireLevels(nrFLs)
#if USE_FLAMES_NOFLAMES_OBS
        ,_m_nrObsPerHouse(2)
#else
        ,_m_nrObsPerHouse(nrFLs) // each firelevel is a type
#endif
        ,_m_nrActionsPerAgent(nrActionsPerAgent)
        ,_m_nrObservedHousesPerAgents(nrObservedHousesPerAgent)
        ,_m_k(k)
        //this means that there is no limit on how many agents can observe a house:
        //,_m_maxNrAgentsObservingAHouse(nrAgents)
        ,_m_maxNrAgentsObservingAHouse(k)//<-this means that there is no limit on how many agents can observe a house
        ,_m_Norm_cache()
        ,_m_agentsForHouse_action(nrHouses, Scope())
        ,_m_agentsForHouse_obs(nrHouses, Scope())
        ,_m_houseIndices_obs(nrAgents, vector<Index>() )
        ,_m_houseIndices_action(nrAgents, vector<Index>() )
        ,_m_housePositionX(nrHouses, -1.0)
        ,_m_housePositionY(nrHouses, -1.0)
        ,_m_agentPositionX(nrAgents, -1.0)
        ,_m_agentPositionY(nrAgents, -1.0)


{
    //cout << "Problem_CGBG_FF::constructor...\n";
    //cout << "nrFLs=" << nrFLs;
    //cout << "\nnrObservedHousesPerAgent="<<nrObservedHousesPerAgent;
    //cout << "\nnr types:"<< SoftPrintVector( this->GetNrTypes() ) << endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
        _m_allAgents.Insert(agI);
    ScatterHouses();
    ScatterAgents();
    AssignAgentActionsToHouses();
    AssignAgentTypesToHouses();

    //print summarization of assignment:
    cout << "-------------------"<<endl;
    cout << "Assignment summary:"<<endl;
    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        cout << "Agent "<<agI<<"...\n\tcan fight fire at houses:"<<
        SoftPrintVector(_m_houseIndices_action.at(agI)) <<
        "\n\tand can observe houses:" <<
        SoftPrintVector(_m_houseIndices_obs.at(agI)) << endl;
    }
#if DEBUGASSIGN
    for(Index hI=0; hI < _m_nrHouses; hI++)
    {
        cout << "House "<<hI<<"...\n\tcan be visited by agents :"<<
        _m_agentsForHouse_action.at(hI) <<
        "\n\tand by observed by agents:" <<
        _m_agentsForHouse_obs.at(hI) << endl;
    }
#endif
    cout << "-------------------"<<endl;


    //can we do an automatic reduction? I.e., when same scopes, the 
    //edges are combined ? 
    //Would that be something we would want? (perhaps not? the number of edges becomes variable)
    for(Index hI=0; hI < _m_nrHouses; hI++)
        AddEdge(hI);

}